

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocument_p.cpp
# Opt level: O1

QTextFrame * __thiscall
QTextDocumentPrivate::insertFrame
          (QTextDocumentPrivate *this,int start,int end,QTextFrameFormat *format)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  QTextFrame *pQVar4;
  QTextFrame *pQVar5;
  QTextObject *this_00;
  long in_FS_OFFSET;
  undefined1 local_48 [16];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (start != end) {
    pQVar4 = frameAt(this,start);
    pQVar5 = frameAt(this,end);
    if (pQVar4 != pQVar5) {
      this_00 = (QTextObject *)0x0;
      goto LAB_004de7d6;
    }
  }
  iVar1 = this->editBlock;
  this->editBlock = iVar1 + 1;
  if (iVar1 == 0) {
    this->revision = this->revision + 1;
  }
  createObject(this,&format->super_QTextFormat,-1);
  this_00 = (QTextObject *)QMetaObject::cast((QObject *)&QTextFrame::staticMetaObject);
  QTextBlockFormat::QTextBlockFormat((QTextBlockFormat *)local_48);
  iVar1 = QTextFormatCollection::indexForFormat(&this->formats,(QTextFormat *)local_48);
  QTextFormat::~QTextFormat((QTextFormat *)local_48);
  local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QTextCharFormat::QTextCharFormat((QTextCharFormat *)local_48);
  iVar2 = QTextObject::objectIndex(this_00);
  QTextFormat::setObjectIndex((QTextFormat *)local_48,iVar2);
  iVar2 = QTextFormatCollection::indexForFormat(&this->formats,(QTextFormat *)local_48);
  insertBlock(this,(QChar)0xfdd0,start,iVar1,iVar2,MoveCursor);
  insertBlock(this,(QChar)0xfdd1,end + 1,iVar1,iVar2,KeepCursor);
  uVar3 = QFragmentMapData<QTextFragmentData>::findNode(&(this->fragments).data,start,0);
  *(uint *)(*(long *)&this_00->field_0x8 + 0x84) = uVar3;
  uVar3 = QFragmentMapData<QTextFragmentData>::findNode(&(this->fragments).data,end + 1,0);
  *(uint *)(*(long *)&this_00->field_0x8 + 0x88) = uVar3;
  insert_frame(this,(QTextFrame *)this_00);
  endEditBlock(this);
  QTextFormat::~QTextFormat((QTextFormat *)local_48);
LAB_004de7d6:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (QTextFrame *)this_00;
  }
  __stack_chk_fail();
}

Assistant:

QTextFrame *QTextDocumentPrivate::insertFrame(int start, int end, const QTextFrameFormat &format)
{
    Q_ASSERT(start >= 0 && start < length());
    Q_ASSERT(end >= 0 && end < length());
    Q_ASSERT(start <= end || end == -1);

    if (start != end && frameAt(start) != frameAt(end))
        return nullptr;

    beginEditBlock();

    QTextFrame *frame = qobject_cast<QTextFrame *>(createObject(format));
    Q_ASSERT(frame);

    // #### using the default block and char format below might be wrong
    int idx = formats.indexForFormat(QTextBlockFormat());
    QTextCharFormat cfmt;
    cfmt.setObjectIndex(frame->objectIndex());
    int charIdx = formats.indexForFormat(cfmt);

    insertBlock(QTextBeginningOfFrame, start, idx, charIdx, QTextUndoCommand::MoveCursor);
    insertBlock(QTextEndOfFrame, ++end, idx, charIdx, QTextUndoCommand::KeepCursor);

    frame->d_func()->fragment_start = find(start).n;
    frame->d_func()->fragment_end = find(end).n;

    insert_frame(frame);

    endEditBlock();

    return frame;
}